

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

void __thiscall t_rs_generator::generate_struct(t_rs_generator *this,t_struct *tstruct)

{
  int iVar1;
  undefined8 *puVar2;
  string local_38;
  
  if (tstruct->is_union_ == true) {
    render_union(this,tstruct);
    return;
  }
  iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xb])(tstruct);
  if ((char)iVar1 != '\0') {
    rust_struct_name_abi_cxx11_(&local_38,this,tstruct);
    render_struct(this,&local_38,tstruct,T_REGULAR);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "cannot generate struct for exception";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

void t_rs_generator::generate_struct(t_struct* tstruct) {
  if (tstruct->is_union()) {
    render_union(tstruct);
  } else if (tstruct->is_struct()) {
    render_struct(rust_struct_name(tstruct), tstruct, t_rs_generator::T_REGULAR);
  } else {
    throw "cannot generate struct for exception";
  }
}